

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  __type _Var2;
  istream *piVar3;
  ostream *poVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar13 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  Vec<3U,_float> VVar14;
  int __status;
  float dx;
  int padding;
  allocator<char> local_891;
  Vec<3U,_float> local_890;
  ulong local_880;
  Array3f phi_grid;
  Vec<3U,_float> local_850;
  Vec3ui sizes;
  char c_1;
  float local_830;
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> faceList;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> vertList;
  string outname;
  int v2;
  int v1;
  string filename;
  string line;
  ofstream outfile;
  ifstream infile;
  byte abStack_528 [488];
  stringstream arg2;
  stringstream arg3;
  
  if (argc == 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,argv[1],(allocator<char> *)&infile);
    if (4 < filename._M_string_length) {
      std::__cxx11::string::substr((ulong)&infile,(ulong)&filename);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&outfile,".obj",(allocator<char> *)&arg2);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &infile,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&outfile);
      std::__cxx11::string::~string((string *)&outfile);
      std::__cxx11::string::~string((string *)&infile);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&infile,argv[2],(allocator<char> *)&outfile);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&arg2,(string *)&infile,_S_out|_S_in);
        std::__cxx11::string::~string((string *)&infile);
        std::istream::_M_extract<float>((float *)&arg2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&infile,argv[3],(allocator<char> *)&outfile);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&arg3,(string *)&infile,_S_out|_S_in);
        std::__cxx11::string::~string((string *)&infile);
        std::istream::operator>>((istream *)&arg3,&padding);
        if (padding < 1) {
          padding = 1;
        }
        auVar6._8_4_ = 0x7f7fffff;
        auVar6._0_8_ = 0x7f7fffff7f7fffff;
        auVar6._12_4_ = 0x7f7fffff;
        local_890.v._0_8_ = vmovlps_avx(auVar6);
        local_890.v[2] = 3.4028235e+38;
        auVar7._8_4_ = 0xff7fffff;
        auVar7._0_8_ = 0xff7fffffff7fffff;
        auVar7._12_4_ = 0xff7fffff;
        local_850.v._0_8_ = vmovlps_avx(auVar7);
        local_850.v[2] = -3.4028235e+38;
        std::operator<<((ostream *)&std::cout,"Reading data.\n");
        std::ifstream::ifstream(&infile,argv[1],_S_in);
        if ((abStack_528[*(long *)(_infile + -0x18)] & 5) == 0) {
          line._M_dataplus._M_p = (pointer)&line.field_2;
          line._M_string_length = 0;
          line.field_2._M_local_buf[0] = '\0';
          vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vertList.super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          faceList.
          super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          faceList.
          super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          faceList.
          super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_880 = 0;
          do {
            while( true ) {
              if ((abStack_528[*(long *)(_infile + -0x18)] & 2) != 0) {
                std::ifstream::close();
                if (0 < (int)local_880) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"Warning: ");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)local_880);
                  std::operator<<(poVar4,
                                  " lines were ignored since they did not contain faces or vertices.\n"
                                 );
                }
                poVar4 = std::operator<<((ostream *)&std::cout,"Read in ");
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                poVar4 = std::operator<<(poVar4," vertices and ");
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                poVar4 = std::operator<<(poVar4," faces.");
                std::endl<char,std::char_traits<char>>(poVar4);
                auVar8._8_4_ = 0x3f800000;
                auVar8._0_8_ = 0x3f8000003f800000;
                auVar8._12_4_ = 0x3f800000;
                _c_1 = vmovlps_avx(auVar8);
                local_830 = 1.0;
                auVar13 = (undefined1  [56])0x0;
                VVar14 = operator*((float)padding * dx,(Vec<3U,_float> *)&c_1);
                auVar9._0_8_ = VVar14.v._0_8_;
                auVar9._8_56_ = auVar13;
                _outfile = (pointer)vmovlps_avx(auVar9._0_16_);
                Vec<3U,_float>::operator-=(&local_890,(Vec<3U,_float> *)&outfile);
                auVar13 = (undefined1  [56])0x0;
                VVar14 = operator*((float)padding * dx,(Vec<3U,_float> *)&c_1);
                auVar10._0_8_ = VVar14.v._0_8_;
                auVar10._8_56_ = auVar13;
                _outfile = (pointer)vmovlps_avx(auVar10._0_16_);
                Vec<3U,_float>::operator+=(&local_850,(Vec<3U,_float> *)&outfile);
                VVar14 = Vec<3U,_float>::operator-(&local_850,&local_890);
                phi_grid.nk = VVar14.v[2];
                auVar11._0_8_ = VVar14.v._0_8_;
                auVar11._8_56_ = auVar13;
                phi_grid._0_8_ = vmovlps_avx(auVar11._0_16_);
                auVar13 = (undefined1  [56])0x0;
                VVar14 = Vec<3U,_float>::operator/((Vec<3U,_float> *)&phi_grid,dx);
                auVar12._0_8_ = VVar14.v._0_8_;
                auVar12._8_56_ = auVar13;
                _outfile = (pointer)vmovlps_avx(auVar12._0_16_);
                Vec<3U,_unsigned_int>::Vec<float>(&sizes,(Vec<3U,_float> *)&outfile);
                poVar4 = std::operator<<((ostream *)&std::cout,"Bound box size: (");
                poVar4 = operator<<(poVar4,&local_890);
                poVar4 = std::operator<<(poVar4,") to (");
                poVar4 = operator<<(poVar4,&local_850);
                poVar4 = std::operator<<(poVar4,") with dimensions ");
                poVar4 = operator<<(poVar4,&sizes);
                poVar4 = std::operator<<(poVar4,".");
                std::endl<char,std::char_traits<char>>(poVar4);
                std::operator<<((ostream *)&std::cout,"Computing signed distance field.\n");
                phi_grid.ni = 0;
                phi_grid.nj = 0;
                phi_grid.nk = 0;
                phi_grid.a.n = 0;
                phi_grid.a.max_n = 0;
                phi_grid.a.data = (float *)0x0;
                make_level_set3(&faceList,&vertList,&local_890,dx,sizes.v[0],sizes.v[1],sizes.v[2],
                                &phi_grid,1);
                outname._M_dataplus._M_p = (pointer)&outname.field_2;
                outname._M_string_length = 0;
                outname.field_2._M_local_buf[0] = '\0';
                std::__cxx11::string::substr((ulong)&v1,(ulong)&filename);
                std::__cxx11::string::string<std::allocator<char>>((string *)&v2,".sdf",&local_891);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &outfile,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&v1,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &v2);
                std::__cxx11::string::operator=((string *)&outname,(string *)&outfile);
                std::__cxx11::string::~string((string *)&outfile);
                std::__cxx11::string::~string((string *)&v2);
                std::__cxx11::string::~string((string *)&v1);
                poVar4 = std::operator<<((ostream *)&std::cout,"Writing results to: ");
                poVar4 = std::operator<<(poVar4,(string *)&outname);
                std::operator<<(poVar4,"\n");
                std::ofstream::ofstream(&outfile,outname._M_dataplus._M_p,_S_out);
                poVar4 = (ostream *)std::ostream::operator<<(&outfile,phi_grid.ni);
                poVar4 = std::operator<<(poVar4," ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,phi_grid.nj);
                poVar4 = std::operator<<(poVar4," ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,phi_grid.nk);
                std::endl<char,std::char_traits<char>>(poVar4);
                poVar4 = (ostream *)std::ostream::operator<<(&outfile,local_890.v[0]);
                poVar4 = std::operator<<(poVar4," ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_890.v[1]);
                poVar4 = std::operator<<(poVar4," ");
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_890.v[2]);
                std::endl<char,std::char_traits<char>>(poVar4);
                poVar4 = (ostream *)std::ostream::operator<<(&outfile,dx);
                std::endl<char,std::char_traits<char>>(poVar4);
                for (uVar5 = 0; uVar5 < phi_grid.a.n; uVar5 = uVar5 + 1) {
                  poVar4 = (ostream *)std::ostream::operator<<(&outfile,phi_grid.a.data[uVar5]);
                  std::endl<char,std::char_traits<char>>(poVar4);
                }
                std::ofstream::close();
                std::operator<<((ostream *)&std::cout,"Processing complete.\n");
                std::ofstream::~ofstream(&outfile);
                std::__cxx11::string::~string((string *)&outname);
                Array3<float,_Array1<float>_>::~Array3(&phi_grid);
                std::_Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>::
                ~_Vector_base(&faceList.
                               super__Vector_base<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>
                             );
                std::_Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::~_Vector_base
                          (&vertList.
                            super__Vector_base<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>);
                std::__cxx11::string::~string((string *)&line);
                std::ifstream::~ifstream(&infile);
                std::__cxx11::stringstream::~stringstream((stringstream *)&arg3);
                std::__cxx11::stringstream::~stringstream((stringstream *)&arg2);
                std::__cxx11::string::~string((string *)&filename);
                return 0;
              }
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&infile,(string *)&line);
              std::__cxx11::string::substr((ulong)&outfile,(ulong)&line);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&phi_grid,"v",(allocator<char> *)&v2);
              _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&outfile,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&phi_grid);
              if (!_Var2) break;
              std::__cxx11::string::substr((ulong)&outname,(ulong)&line);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&v1,"vn",(allocator<char> *)&c_1);
              bVar1 = std::operator!=(&outname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&v1);
              std::__cxx11::string::~string((string *)&v1);
              std::__cxx11::string::~string((string *)&outname);
              std::__cxx11::string::~string((string *)&phi_grid);
              std::__cxx11::string::~string((string *)&outfile);
              if (!bVar1) goto LAB_001037df;
              std::__cxx11::stringstream::stringstream
                        ((stringstream *)&outfile,(string *)&line,_S_out|_S_in);
              piVar3 = std::operator>>((istream *)&outfile,(char *)&outname);
              piVar3 = std::istream::_M_extract<float>((float *)piVar3);
              piVar3 = std::istream::_M_extract<float>((float *)piVar3);
              std::istream::_M_extract<float>((float *)piVar3);
              std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::push_back
                        (&vertList,(value_type *)&phi_grid);
              update_minmax<3u,float>((Vec<3U,_float> *)&phi_grid,&local_890,&local_850);
LAB_001038a0:
              std::__cxx11::stringstream::~stringstream((stringstream *)&outfile);
            }
            std::__cxx11::string::~string((string *)&phi_grid);
            std::__cxx11::string::~string((string *)&outfile);
LAB_001037df:
            std::__cxx11::string::substr((ulong)&outfile,(ulong)&line);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&phi_grid,"f",(allocator<char> *)&outname);
            _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&outfile,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&phi_grid);
            std::__cxx11::string::~string((string *)&phi_grid);
            std::__cxx11::string::~string((string *)&outfile);
            if (_Var2) {
              std::__cxx11::stringstream::stringstream
                        ((stringstream *)&outfile,(string *)&line,_S_out|_S_in);
              piVar3 = std::operator>>((istream *)&outfile,&c_1);
              piVar3 = (istream *)std::istream::operator>>(piVar3,(int *)&outname);
              piVar3 = (istream *)std::istream::operator>>(piVar3,&v1);
              std::istream::operator>>(piVar3,&v2);
              phi_grid.nk = v2 + -1;
              phi_grid.nj = v1 + -1;
              phi_grid.ni = (int)outname._M_dataplus._M_p + -1;
              std::vector<Vec<3u,unsigned_int>,std::allocator<Vec<3u,unsigned_int>>>::
              emplace_back<Vec<3u,unsigned_int>>
                        ((vector<Vec<3u,unsigned_int>,std::allocator<Vec<3u,unsigned_int>>> *)
                         &faceList,(Vec<3U,_unsigned_int> *)&phi_grid);
              goto LAB_001038a0;
            }
            std::__cxx11::string::substr((ulong)&outfile,(ulong)&line);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&phi_grid,"vn",(allocator<char> *)&outname);
            _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&outfile,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&phi_grid);
            std::__cxx11::string::~string((string *)&phi_grid);
            std::__cxx11::string::~string((string *)&outfile);
            if (_Var2) {
              std::operator<<((ostream *)&std::cerr,
                              "Obj-loader is not able to parse vertex normals, please strip them from the input file. \n"
                             );
              __status = -2;
              goto LAB_00103f2c;
            }
            local_880 = (ulong)((int)local_880 + 1);
          } while( true );
        }
        std::operator<<((ostream *)&std::cerr,"Failed to open. Terminating.\n");
        goto LAB_00103f2a;
      }
    }
    std::operator<<((ostream *)&std::cerr,
                    "Error: Expected OBJ file with filename of the form <name>.obj.\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "SDFGen - A utility for converting closed oriented triangle meshes into grid-based signed distance fields.\n"
                   );
    std::operator<<((ostream *)&std::cout,"\nThe output file format is:");
    std::operator<<((ostream *)&std::cout,"<ni> <nj> <nk>\n");
    std::operator<<((ostream *)&std::cout,"<origin_x> <origin_y> <origin_z>\n");
    std::operator<<((ostream *)&std::cout,"<dx>\n");
    std::operator<<((ostream *)&std::cout,"<value_1> <value_2> <value_3> [...]\n\n");
    std::operator<<((ostream *)&std::cout,
                    "(ni,nj,nk) are the integer dimensions of the resulting distance field.\n");
    std::operator<<((ostream *)&std::cout,
                    "(origin_x,origin_y,origin_z) is the 3D position of the grid origin.\n");
    std::operator<<((ostream *)&std::cout,"<dx> is the grid spacing.\n\n");
    std::operator<<((ostream *)&std::cout,
                    "<value_n> are the signed distance data values, in ascending order of i, then j, then k.\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "The output filename will match that of the input, with the OBJ suffix replaced with SDF.\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"Usage: SDFGen <filename> <dx> <padding>\n\n");
    std::operator<<((ostream *)&std::cout,"Where:\n");
    std::operator<<((ostream *)&std::cout,
                    "\t<filename> specifies a Wavefront OBJ (text) file representing a *triangle* mesh (no quad or poly meshes allowed). File must use the suffix \".obj\".\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "\t<dx> specifies the length of grid cell in the resulting distance field.\n");
    std::operator<<((ostream *)&std::cout,
                    "\t<padding> specifies the number of cells worth of padding between the object bound box and the boundary of the distance field grid. Minimum is 1.\n\n"
                   );
  }
LAB_00103f2a:
  __status = -1;
LAB_00103f2c:
  exit(__status);
}

Assistant:

int main(int argc, char* argv[]) {
  
  if(argc != 4) {
    std::cout << "SDFGen - A utility for converting closed oriented triangle meshes into grid-based signed distance fields.\n";
    std::cout << "\nThe output file format is:";
    std::cout << "<ni> <nj> <nk>\n";
    std::cout << "<origin_x> <origin_y> <origin_z>\n";
    std::cout << "<dx>\n";
    std::cout << "<value_1> <value_2> <value_3> [...]\n\n";
    
    std::cout << "(ni,nj,nk) are the integer dimensions of the resulting distance field.\n";
    std::cout << "(origin_x,origin_y,origin_z) is the 3D position of the grid origin.\n";
    std::cout << "<dx> is the grid spacing.\n\n";
    std::cout << "<value_n> are the signed distance data values, in ascending order of i, then j, then k.\n";

    std::cout << "The output filename will match that of the input, with the OBJ suffix replaced with SDF.\n\n";

    std::cout << "Usage: SDFGen <filename> <dx> <padding>\n\n";
    std::cout << "Where:\n";
    std::cout << "\t<filename> specifies a Wavefront OBJ (text) file representing a *triangle* mesh (no quad or poly meshes allowed). File must use the suffix \".obj\".\n";
    std::cout << "\t<dx> specifies the length of grid cell in the resulting distance field.\n";
    std::cout << "\t<padding> specifies the number of cells worth of padding between the object bound box and the boundary of the distance field grid. Minimum is 1.\n\n";
    
    exit(-1);
  }

  std::string filename(argv[1]);
  if(filename.size() < 5 || filename.substr(filename.size()-4) != std::string(".obj")) {
    std::cerr << "Error: Expected OBJ file with filename of the form <name>.obj.\n";
    exit(-1);
  }

  std::stringstream arg2(argv[2]);
  float dx;
  arg2 >> dx;
  
  std::stringstream arg3(argv[3]);
  int padding;
  arg3 >> padding;

  if(padding < 1) padding = 1;
  //start with a massive inside out bound box.
  Vec3f min_box(std::numeric_limits<float>::max(),std::numeric_limits<float>::max(),std::numeric_limits<float>::max()), 
    max_box(-std::numeric_limits<float>::max(),-std::numeric_limits<float>::max(),-std::numeric_limits<float>::max());
  
  std::cout << "Reading data.\n";

  std::ifstream infile(argv[1]);
  if(!infile) {
    std::cerr << "Failed to open. Terminating.\n";
    exit(-1);
  }

  int ignored_lines = 0;
  std::string line;
  std::vector<Vec3f> vertList;
  std::vector<Vec3ui> faceList;
  while(!infile.eof()) {
    std::getline(infile, line);

    //.obj files sometimes contain vertex normals indicated by "vn"
    if(line.substr(0,1) == std::string("v") && line.substr(0,2) != std::string("vn")){
      std::stringstream data(line);
      char c;
      Vec3f point;
      data >> c >> point[0] >> point[1] >> point[2];
      vertList.push_back(point);
      update_minmax(point, min_box, max_box);
    }
    else if(line.substr(0,1) == std::string("f")) {
      std::stringstream data(line);
      char c;
      int v0,v1,v2;
      data >> c >> v0 >> v1 >> v2;
      faceList.push_back(Vec3ui(v0-1,v1-1,v2-1));
    }
    else if( line.substr(0,2) == std::string("vn") ){
      std::cerr << "Obj-loader is not able to parse vertex normals, please strip them from the input file. \n";
      exit(-2); 
    }
    else {
      ++ignored_lines; 
    }
  }
  infile.close();
  
  if(ignored_lines > 0)
    std::cout << "Warning: " << ignored_lines << " lines were ignored since they did not contain faces or vertices.\n";

  std::cout << "Read in " << vertList.size() << " vertices and " << faceList.size() << " faces." << std::endl;

  //Add padding around the box.
  Vec3f unit(1,1,1);
  min_box -= padding*dx*unit;
  max_box += padding*dx*unit;
  Vec3ui sizes = Vec3ui((max_box - min_box)/dx);
  
  std::cout << "Bound box size: (" << min_box << ") to (" << max_box << ") with dimensions " << sizes << "." << std::endl;

  std::cout << "Computing signed distance field.\n";
  Array3f phi_grid;
  make_level_set3(faceList, vertList, min_box, dx, sizes[0], sizes[1], sizes[2], phi_grid);

  std::string outname;

  #ifdef HAVE_VTK
    // If compiled with VTK, we can directly output a volumetric image format instead
    //Very hackily strip off file suffix.
    outname = filename.substr(0, filename.size()-4) + std::string(".vti");
    std::cout << "Writing results to: " << outname << "\n";
    vtkSmartPointer<vtkImageData> output_volume = vtkSmartPointer<vtkImageData>::New();

    output_volume->SetDimensions(phi_grid.ni ,phi_grid.nj ,phi_grid.nk);
    output_volume->SetOrigin( phi_grid.ni*dx/2, phi_grid.nj*dx/2,phi_grid.nk*dx/2);
    output_volume->SetSpacing(dx,dx,dx);

    vtkSmartPointer<vtkFloatArray> distance = vtkSmartPointer<vtkFloatArray>::New();
    
    distance->SetNumberOfTuples(phi_grid.a.size());
    
    output_volume->GetPointData()->AddArray(distance);
    distance->SetName("Distance");

    for(unsigned int i = 0; i < phi_grid.a.size(); ++i) {
      distance->SetValue(i, phi_grid.a[i]);
    }

    vtkSmartPointer<vtkXMLImageDataWriter> writer =
    vtkSmartPointer<vtkXMLImageDataWriter>::New();
    writer->SetFileName(outname.c_str());

    #if VTK_MAJOR_VERSION <= 5
      writer->SetInput(output_volume);
    #else
      writer->SetInputData(output_volume);
    #endif
    writer->Write();

  #else
    // if VTK support is missing, default back to the original ascii file-dump.
    //Very hackily strip off file suffix.
    outname = filename.substr(0, filename.size()-4) + std::string(".sdf");
    std::cout << "Writing results to: " << outname << "\n";
    
    std::ofstream outfile( outname.c_str());
    outfile << phi_grid.ni << " " << phi_grid.nj << " " << phi_grid.nk << std::endl;
    outfile << min_box[0] << " " << min_box[1] << " " << min_box[2] << std::endl;
    outfile << dx << std::endl;
    for(unsigned int i = 0; i < phi_grid.a.size(); ++i) {
      outfile << phi_grid.a[i] << std::endl;
    }
    outfile.close();
  #endif

  std::cout << "Processing complete.\n";

return 0;
}